

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilsTest.hpp
# Opt level: O3

void Qentem::Test::TestTrimRight(QTest *test)

{
  uint *puVar1;
  ulong uVar2;
  undefined8 local_38;
  
  puVar1 = (uint *)((long)&local_38 + 4);
  local_38 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0xf4);
  local_38 = local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0xf7);
  local_38 = local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0xfa);
  uVar2 = local_38 >> 0x20;
  if (uVar2 != 0) {
    do {
      if ((0x20 < (ulong)(byte)"   a"[uVar2 + 2]) ||
         ((0x100002600U >> ((ulong)(byte)"   a"[uVar2 + 2] & 0x3f) & 1) == 0)) {
        local_38 = uVar2 << 0x20;
        goto LAB_00101cdb;
      }
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
    local_38 = 0;
  }
LAB_00101cdb:
  local_38 = local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>
            (test,(uint *)((long)&local_38 + 4),(uint *)&local_38,0xfd);
  uVar2 = local_38 >> 0x20;
  if (uVar2 != 0) {
    do {
      if ((0x20 < (ulong)(byte)"   abc"[uVar2 + 2]) ||
         ((0x100002600U >> ((ulong)(byte)"   abc"[uVar2 + 2] & 0x3f) & 1) == 0)) {
        local_38 = uVar2 << 0x20;
        goto LAB_00101d2c;
      }
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
    local_38 = 0;
  }
LAB_00101d2c:
  local_38 = local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>
            (test,(uint *)((long)&local_38 + 4),(uint *)&local_38,0x100);
  uVar2 = local_38 >> 0x20;
  if (1 < uVar2) {
    do {
      if ((0x20 < (ulong)(byte)" a "[uVar2]) ||
         ((0x100002600U >> ((ulong)(byte)" a "[uVar2] & 0x3f) & 1) == 0)) {
        local_38 = uVar2 << 0x20;
        goto LAB_00101d82;
      }
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
    local_38 = 0x100000000;
  }
LAB_00101d82:
  local_38 = local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>
            (test,(uint *)((long)&local_38 + 4),(uint *)&local_38,0x103);
  uVar2 = local_38 >> 0x20;
  if (4 < uVar2) {
    do {
      if ((0x20 < (ulong)(byte)" abc "[uVar2]) ||
         ((0x100002600U >> ((ulong)(byte)" abc "[uVar2] & 0x3f) & 1) == 0)) {
        local_38 = uVar2 << 0x20;
        goto LAB_00101dd8;
      }
      uVar2 = uVar2 - 1;
    } while (4 < uVar2);
    local_38 = 0x400000000;
  }
LAB_00101dd8:
  local_38 = local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>
            (test,(uint *)((long)&local_38 + 4),(uint *)&local_38,0x106);
  uVar2 = local_38 >> 0x20;
  if (3 < uVar2) {
    do {
      if ((0x20 < (ulong)(byte)"  a  "[uVar2 + 1]) ||
         ((0x100002600U >> ((ulong)(byte)"  a  "[uVar2 + 1] & 0x3f) & 1) == 0)) {
        local_38 = uVar2 << 0x20;
        goto LAB_00101e2e;
      }
      uVar2 = uVar2 - 1;
    } while (3 < uVar2);
    local_38 = 0x300000000;
  }
LAB_00101e2e:
  local_38 = local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>
            (test,(uint *)((long)&local_38 + 4),(uint *)&local_38,0x109);
  uVar2 = local_38 >> 0x20;
  if (5 < uVar2) {
    do {
      if ((0x20 < (ulong)(byte)"  abc  "[uVar2 + 1]) ||
         ((0x100002600U >> ((ulong)(byte)"  abc  "[uVar2 + 1] & 0x3f) & 1) == 0)) {
        local_38 = uVar2 << 0x20;
        goto LAB_00101e84;
      }
      uVar2 = uVar2 - 1;
    } while (5 < uVar2);
    local_38 = 0x500000000;
  }
LAB_00101e84:
  local_38 = local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>
            (test,(uint *)((long)&local_38 + 4),(uint *)&local_38,0x10c);
  uVar2 = local_38 >> 0x20;
  if (4 < uVar2) {
    do {
      if ((0x20 < (ulong)(byte)"   a   "[uVar2 + 2]) ||
         ((0x100002600U >> ((ulong)(byte)"   a   "[uVar2 + 2] & 0x3f) & 1) == 0)) {
        local_38 = uVar2 << 0x20;
        goto LAB_00101eda;
      }
      uVar2 = uVar2 - 1;
    } while (4 < uVar2);
    local_38 = 0x400000000;
  }
LAB_00101eda:
  local_38 = local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>
            (test,(uint *)((long)&local_38 + 4),(uint *)&local_38,0x10f);
  uVar2 = local_38 >> 0x20;
  if (6 < uVar2) {
    do {
      if ((0x20 < (ulong)(byte)"   abc   "[uVar2 + 2]) ||
         ((0x100002600U >> ((ulong)(byte)"   abc   "[uVar2 + 2] & 0x3f) & 1) == 0)) {
        local_38 = uVar2 << 0x20;
        goto LAB_00101f30;
      }
      uVar2 = uVar2 - 1;
    } while (6 < uVar2);
    local_38 = 0x600000000;
  }
LAB_00101f30:
  puVar1 = (uint *)((long)&local_38 + 4);
  local_38 = local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x112);
  local_38 = 0x100000001;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x116);
  local_38 = 0x300000003;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x11a);
  local_38 = 0x100000001;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x11e);
  local_38 = 0x300000003;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x122);
  local_38 = 0x400000004;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x126);
  local_38 = 0x100000001;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x12a);
  local_38 = 0x600000006;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x12e);
  local_38 = 0x300000003;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x132);
  local_38 = 0x300000003;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x136);
  local_38 = 0x300000003;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x13a);
  local_38 = 0x200000002;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x13e);
  local_38 = 0x200000002;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x142);
  local_38 = 0x200000002;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x146);
  local_38 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x14a);
  local_38 = 0x100000001;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x14e);
  local_38 = 0x400000004;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x152);
  local_38 = 0x300000003;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x156);
  local_38 = 0x500000005;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x15a);
  local_38 = 0x400000004;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x15e);
  local_38 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x162);
  local_38 = 0x200000002;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x166);
  local_38 = 0x100000001;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x16a);
  local_38 = 0x600000006;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x16e);
  local_38 = 0x500000005;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x172);
  local_38 = 0x400000004;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x176);
  local_38 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x17a);
  local_38 = 0x100000001;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x17e);
  local_38 = 0x200000002;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x182);
  local_38 = 0x200000002;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x186);
  local_38 = 0x400000004;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x18a);
  local_38 = 0x400000004;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x18e);
  local_38 = 0x200000002;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x192);
  local_38 = 0x400000004;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x196);
  local_38 = 0x300000003;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x19a);
  local_38 = 0x500000005;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x19e);
  local_38 = 0x100000001;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x1a2);
  local_38 = 0x200000002;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x1a6);
  local_38 = 0x300000003;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x1aa);
  local_38 = 0x300000003;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x1ae);
  local_38 = 0x500000005;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x1b2);
  local_38 = 0x400000004;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x1b6);
  local_38 = 0x600000006;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x1ba);
  local_38 = 0x600000006;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x1be);
  local_38 = 0x500000005;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,puVar1,(uint *)&local_38,0x1c2);
  return;
}

Assistant:

static void TestTrimRight(QTest &test) {
    SizeT32 end_offset = 0;

    StringUtils::TrimRight("", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("", 1U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("", 10U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("a", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("abc", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("a ", 1U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("abc ", 4U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("a  ", 3U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("abc  ", 5U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("a   ", 4U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("abc   ", 6U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight("a ", 0U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("abc ", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("a  ", 0U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight("abc  ", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("a   ", 4U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("a   ", 0U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("abc   ", 6U, end_offset);
    test.IsEqual(end_offset, 6U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("abc   ", 3U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("abc   ", 2U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("abc   ", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight(" a", 0U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight(" a", 1U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight(" a", 2U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 1;
    StringUtils::TrimRight(" a", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    end_offset = 1;
    StringUtils::TrimRight(" a", 1U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight(" abc", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("  a", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight("  abc", 0U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("   a", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   a", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   a", 2U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   a", 1U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("   abc", 0U, end_offset);
    test.IsEqual(end_offset, 6U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight("   abc", 0U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("   abc", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   abc", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   abc", 1U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   abc", 2U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight(" a ", 0U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight(" abc ", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight(" a  ", 4U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight(" a\n\r\t", 0U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight(" abc  ", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("  a   ", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 8;
    StringUtils::TrimRight("  abc   ", 0U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);

    end_offset = 1;
    StringUtils::TrimRight(" ", 1U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight("  ", 2U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   ", 3U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight(" a ", 3U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight(" abc ", 5U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight(" a  ", 4U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight(" abc  ", 6U, end_offset);
    test.IsEqual(end_offset, 6U, __LINE__);

    end_offset = 7;
    StringUtils::TrimRight("  a    ", 6U, end_offset);
    test.IsEqual(end_offset, 6U, __LINE__);

    end_offset = 8;
    StringUtils::TrimRight("  abc   ", 4U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);
}